

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greedy-lineage.hxx
# Opt level: O1

EdgeOperation * __thiscall
lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::proposeMove
          (EdgeOperation *__return_storage_ptr__,
          DynamicLineage<std::vector<double,_std::allocator<double>_>_> *this,size_t v0,size_t v1)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  unsigned_long uVar3;
  uint uVar4;
  pointer pmVar5;
  Data *pDVar6;
  long lVar7;
  pointer puVar8;
  pointer puVar9;
  unsigned_long uVar10;
  ProblemGraph *pPVar11;
  bool bVar12;
  mapped_type_conflict *pmVar13;
  _Base_ptr p_Var14;
  runtime_error *this_00;
  size_t sVar15;
  _Base_ptr p_Var16;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  size_t sVar20;
  unsigned_long uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  *pmVar25;
  pointer this_01;
  unsigned_long uVar26;
  _Base_ptr p_Var27;
  ulong uVar28;
  ulong uVar29;
  double dVar30;
  size_t local_70;
  double local_68;
  undefined8 uStack_60;
  long local_50;
  EdgeOperation *local_48;
  long local_40;
  _Base_ptr local_38;
  
  pmVar5 = (this->vertices_).
           super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(size_t *)((long)&pmVar5[v0]._M_t._M_impl.super__Rb_tree_header + 0x20) != 0) {
    pmVar25 = pmVar5 + v0;
    p_Var1 = &(pmVar25->_M_t)._M_impl.super__Rb_tree_header;
    p_Var14 = (pmVar25->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var16 = &p_Var1->_M_header;
    for (; p_Var14 != (_Base_ptr)0x0; p_Var14 = (&p_Var14->_M_left)[*(ulong *)(p_Var14 + 1) < v1]) {
      if (*(ulong *)(p_Var14 + 1) >= v1) {
        p_Var16 = p_Var14;
      }
    }
    p_Var14 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var16 != p_Var1) && (p_Var14 = p_Var16, v1 < *(ulong *)(p_Var16 + 1)))
    {
      p_Var14 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var14 != p_Var1) {
      local_70 = v1;
      pmVar13 = std::
                map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                ::at(pmVar25,&local_70);
      dVar30 = *pmVar13;
      local_68 = -dVar30;
      pDVar6 = this->data_;
      lVar7 = *(long *)&(pDVar6->problemGraph->problem_->nodes).
                        super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
                        super__Vector_impl_data;
      uVar4 = *(uint *)(lVar7 + v0 * 0x18);
      uVar2 = *(uint *)(lVar7 + v1 * 0x18);
      local_48 = __return_storage_ptr__;
      if (uVar4 == uVar2) {
        puVar8 = (this->partition_).parents_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar15 = v0;
        do {
          uVar23 = sVar15;
          sVar15 = puVar8[uVar23];
        } while (puVar8[uVar23] != uVar23);
        uVar24 = v0;
        if (uVar23 != v0) {
          do {
            uVar28 = puVar8[uVar24];
            puVar8[uVar24] = uVar23;
            uVar24 = uVar28;
          } while (uVar28 != uVar23);
        }
        puVar9 = (this->parents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar24 = puVar9[uVar23];
        uVar28 = uVar24;
        do {
          uVar22 = uVar28;
          uVar28 = puVar8[uVar22];
        } while (puVar8[uVar22] != uVar22);
        while (uVar22 != uVar24) {
          uVar28 = puVar8[uVar24];
          puVar8[uVar24] = uVar22;
          uVar24 = uVar28;
        }
        if (puVar9[uVar23] != uVar22) {
          puVar9[uVar23] = uVar22;
        }
        uVar24 = v1;
        if (uVar22 == uVar23) {
          uVar22 = v0;
        }
        do {
          uVar23 = uVar24;
          uVar24 = puVar8[uVar23];
        } while (puVar8[uVar23] != uVar23);
        sVar15 = v1;
        if (uVar23 != v1) {
          do {
            uVar24 = puVar8[sVar15];
            puVar8[sVar15] = uVar23;
            sVar15 = uVar24;
          } while (uVar24 != uVar23);
        }
        uVar24 = puVar9[uVar23];
        uVar28 = uVar24;
        do {
          uVar29 = uVar28;
          uVar28 = puVar8[uVar29];
        } while (puVar8[uVar29] != uVar29);
        while (uVar29 != uVar24) {
          uVar28 = puVar8[uVar24];
          puVar8[uVar24] = uVar29;
          uVar24 = uVar28;
        }
        if (puVar9[uVar23] != uVar29) {
          puVar9[uVar23] = uVar29;
        }
        if (uVar29 == uVar23) {
          uVar29 = v1;
        }
        if ((uVar22 != v0) == (uVar29 != v1)) {
          if (((uVar22 != v0) || (uVar29 != v1)) &&
             ((dVar30 = INFINITY, uVar22 == v0 || ((uVar29 == v1 || (uVar22 != uVar29))))))
          goto LAB_001238f8;
        }
        else if (uVar4 != 0) {
          sVar15 = v1;
          sVar17 = v0;
          if (uVar22 == v0) {
            do {
              sVar18 = sVar17;
              sVar17 = puVar8[sVar18];
            } while (puVar8[sVar18] != sVar18);
            sVar15 = v0;
            if (sVar18 != v0) {
              do {
                sVar17 = puVar8[sVar15];
                puVar8[sVar15] = sVar18;
                sVar15 = sVar17;
              } while (sVar17 != sVar18);
            }
          }
          else {
            do {
              sVar18 = sVar15;
              sVar15 = puVar8[sVar18];
            } while (puVar8[sVar18] != sVar18);
            sVar15 = v1;
            if (sVar18 != v1) {
              do {
                sVar17 = puVar8[sVar15];
                puVar8[sVar15] = sVar18;
                sVar15 = sVar17;
              } while (sVar17 != sVar18);
            }
          }
          uVar3 = (this->sizes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[sVar18];
          local_68 = local_68 -
                     (((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) *
                     pDVar6->costBirth;
        }
        pmVar5 = (this->vertices_).
                 super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_50 = v1 * 0x30;
        local_38 = &pmVar5[v1]._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var14 = *(_Base_ptr *)((long)&pmVar5[v1]._M_t._M_impl.super__Rb_tree_header + 0x10);
        local_40 = v0 * 3;
        if (p_Var14 != local_38) {
          do {
            sVar15 = *(size_t *)(p_Var14 + 1);
            puVar8 = (this->partition_).parents_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            sVar17 = sVar15;
            do {
              sVar19 = sVar17;
              sVar17 = puVar8[sVar19];
              sVar18 = sVar15;
            } while (puVar8[sVar19] != sVar19);
            while (sVar19 != sVar18) {
              sVar17 = puVar8[sVar18];
              puVar8[sVar18] = sVar19;
              sVar18 = sVar17;
            }
            puVar9 = (this->parents_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            sVar17 = puVar9[sVar19];
            sVar18 = sVar17;
            do {
              sVar20 = sVar18;
              sVar18 = puVar8[sVar20];
            } while (puVar8[sVar20] != sVar20);
            while (sVar20 != sVar17) {
              sVar18 = puVar8[sVar17];
              puVar8[sVar17] = sVar20;
              sVar17 = sVar18;
            }
            if (puVar9[sVar19] != sVar20) {
              puVar9[sVar19] = sVar20;
            }
            if (sVar20 == sVar19) {
              sVar20 = sVar15;
            }
            pmVar5 = (this->vertices_).
                     super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (*(size_t *)((long)&pmVar5[v0]._M_t._M_impl.super__Rb_tree_header + 0x20) != 0) {
              uVar23 = *(ulong *)(p_Var14 + 1);
              this_01 = pmVar5 + v0;
              p_Var1 = &(this_01->_M_t)._M_impl.super__Rb_tree_header;
              p_Var16 = (this_01->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var27 = &p_Var1->_M_header;
              for (; p_Var16 != (_Base_ptr)0x0;
                  p_Var16 = (&p_Var16->_M_left)[*(ulong *)(p_Var16 + 1) < uVar23]) {
                if (*(ulong *)(p_Var16 + 1) >= uVar23) {
                  p_Var27 = p_Var16;
                }
              }
              p_Var16 = &p_Var1->_M_header;
              if (((_Rb_tree_header *)p_Var27 != p_Var1) &&
                 (p_Var16 = p_Var27, uVar23 < *(ulong *)(p_Var27 + 1))) {
                p_Var16 = &p_Var1->_M_header;
              }
              uVar24 = uVar23;
              if ((_Rb_tree_header *)p_Var16 != p_Var1) {
                do {
                  uVar28 = uVar24;
                  uVar24 = puVar8[uVar28];
                } while (puVar8[uVar28] != uVar28);
                while (uVar28 != uVar23) {
                  uVar24 = puVar8[uVar23];
                  puVar8[uVar23] = uVar28;
                  uVar23 = uVar24;
                }
                if (uVar22 == uVar28) {
                  uVar23 = *(ulong *)(p_Var14 + 1);
                  uVar24 = uVar23;
                  do {
                    uVar28 = uVar24;
                    uVar24 = puVar8[uVar28];
                  } while (puVar8[uVar28] != uVar28);
                  while (uVar28 != uVar23) {
                    uVar24 = puVar8[uVar23];
                    puVar8[uVar23] = uVar28;
                    uVar23 = uVar24;
                  }
                  if (uVar29 == uVar28) goto LAB_001233b5;
LAB_00123453:
                  local_70 = *(size_t *)(p_Var14 + 1);
                  this_01 = (pointer)((long)&(pmVar5->_M_t)._M_impl.field_0x0 + local_50);
                }
                else {
LAB_001233b5:
                  uVar23 = *(ulong *)(p_Var14 + 1);
                  uVar24 = uVar23;
                  do {
                    uVar28 = uVar24;
                    uVar24 = puVar8[uVar28];
                  } while (puVar8[uVar28] != uVar28);
                  while (uVar28 != uVar23) {
                    uVar24 = puVar8[uVar23];
                    puVar8[uVar23] = uVar28;
                    uVar23 = uVar24;
                  }
                  if (uVar29 != uVar28) {
LAB_00123413:
                    sVar17 = v0;
                    if (sVar20 != sVar15) {
                      do {
                        sVar15 = sVar17;
                        sVar17 = puVar8[sVar15];
                      } while (puVar8[sVar15] != sVar15);
                      sVar17 = v0;
                      if (sVar15 != v0) {
                        do {
                          sVar18 = puVar8[sVar17];
                          puVar8[sVar17] = sVar15;
                          sVar17 = sVar18;
                        } while (sVar18 != sVar15);
                      }
                      sVar17 = v1;
                      if (sVar20 == sVar15) goto LAB_00123453;
                      do {
                        sVar15 = sVar17;
                        sVar17 = puVar8[sVar15];
                      } while (puVar8[sVar15] != sVar15);
                      sVar17 = v1;
                      if (sVar15 != v1) {
                        do {
                          sVar18 = puVar8[sVar17];
                          puVar8[sVar17] = sVar15;
                          sVar17 = sVar18;
                        } while (sVar18 != sVar15);
                      }
                      if (sVar20 == sVar15) goto LAB_00123493;
                    }
                    goto LAB_001234b6;
                  }
                  uVar23 = *(ulong *)(p_Var14 + 1);
                  uVar24 = uVar23;
                  do {
                    uVar28 = uVar24;
                    uVar24 = puVar8[uVar28];
                  } while (puVar8[uVar28] != uVar28);
                  while (uVar28 != uVar23) {
                    uVar24 = puVar8[uVar23];
                    puVar8[uVar23] = uVar28;
                    uVar23 = uVar24;
                  }
                  if (uVar22 == uVar28) goto LAB_00123413;
LAB_00123493:
                  local_70 = *(size_t *)(p_Var14 + 1);
                }
                pmVar13 = std::
                          map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                          ::at(this_01,&local_70);
                local_68 = local_68 - *pmVar13;
              }
            }
LAB_001234b6:
            p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
          } while (p_Var14 != local_38);
        }
        puVar8 = (this->partition_).parents_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar15 = v0;
        do {
          sVar17 = sVar15;
          sVar15 = puVar8[sVar17];
        } while (puVar8[sVar17] != sVar17);
        sVar15 = v0;
        if (sVar17 != v0) {
          do {
            sVar18 = puVar8[sVar15];
            puVar8[sVar15] = sVar17;
            sVar15 = sVar18;
          } while (sVar18 != sVar17);
        }
        puVar9 = (this->children_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar3 = puVar9[sVar17];
        sVar15 = v1;
        do {
          sVar17 = sVar15;
          sVar15 = puVar8[sVar17];
        } while (puVar8[sVar17] != sVar17);
        sVar15 = v1;
        if (sVar17 != v1) {
          do {
            sVar18 = puVar8[sVar15];
            puVar8[sVar15] = sVar17;
            sVar15 = sVar18;
          } while (sVar18 != sVar17);
        }
        pDVar6 = this->data_;
        dVar30 = local_68;
        if ((puVar9[sVar17] != 0) != (uVar3 != 0)) {
          sVar15 = v0;
          if (pDVar6->problemGraph->numberOfFrames_ - 1 !=
              (long)*(int *)(*(long *)&(pDVar6->problemGraph->problem_->nodes).
                                       super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                       ._M_impl.super__Vector_impl_data + local_40 * 8)) {
            do {
              sVar17 = sVar15;
              sVar15 = puVar8[sVar17];
            } while (puVar8[sVar17] != sVar17);
            sVar15 = v0;
            if (sVar17 != v0) {
              do {
                sVar18 = puVar8[sVar15];
                puVar8[sVar15] = sVar17;
                sVar15 = sVar18;
              } while (sVar18 != sVar17);
            }
            sVar15 = v0;
            sVar18 = v1;
            if (puVar9[sVar17] == 0) {
              do {
                sVar17 = sVar15;
                sVar15 = puVar8[sVar17];
              } while (puVar8[sVar17] != sVar17);
              sVar15 = v0;
              if (sVar17 != v0) {
                do {
                  sVar18 = puVar8[sVar15];
                  puVar8[sVar15] = sVar17;
                  sVar15 = sVar18;
                } while (sVar18 != sVar17);
              }
            }
            else {
              do {
                sVar17 = sVar18;
                sVar18 = puVar8[sVar17];
              } while (puVar8[sVar17] != sVar17);
              sVar15 = v1;
              if (sVar17 != v1) {
                do {
                  sVar18 = puVar8[sVar15];
                  puVar8[sVar15] = sVar17;
                  sVar15 = sVar18;
                } while (sVar18 != sVar17);
              }
            }
            uVar3 = (this->sizes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start[sVar17];
            dVar30 = local_68 -
                     (((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) *
                     pDVar6->costTermination;
          }
          goto LAB_001238f8;
        }
        sVar15 = v0;
        if (pDVar6->enforceBifurcationConstraint != true) goto LAB_001238f8;
        do {
          sVar17 = sVar15;
          sVar15 = puVar8[sVar17];
        } while (puVar8[sVar17] != sVar17);
        sVar15 = v0;
        if (sVar17 != v0) {
          do {
            sVar18 = puVar8[sVar15];
            puVar8[sVar15] = sVar17;
            sVar15 = sVar18;
          } while (sVar18 != sVar17);
        }
        uVar3 = puVar9[sVar17];
        sVar15 = v1;
        do {
          sVar17 = sVar15;
          sVar15 = puVar8[sVar17];
        } while (puVar8[sVar17] != sVar17);
        sVar15 = v1;
        if (sVar17 != v1) {
          do {
            sVar18 = puVar8[sVar15];
            puVar8[sVar15] = sVar17;
            sVar15 = sVar18;
          } while (sVar18 != sVar17);
        }
        if (uVar3 + puVar9[sVar17] < 3) goto LAB_001238f8;
LAB_0012364a:
        dVar30 = INFINITY;
        goto LAB_001238f8;
      }
      sVar17 = v1;
      sVar15 = v0;
      if (uVar4 < uVar2) {
        sVar17 = v0;
        sVar15 = v1;
      }
      if (pDVar6->enforceBifurcationConstraint == true) {
        puVar8 = (this->partition_).parents_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar18 = sVar17;
        do {
          sVar20 = sVar18;
          sVar18 = puVar8[sVar20];
          sVar19 = sVar17;
        } while (puVar8[sVar20] != sVar20);
        while (sVar20 != sVar19) {
          sVar18 = puVar8[sVar19];
          puVar8[sVar19] = sVar20;
          sVar19 = sVar18;
        }
        if (1 < (this->children_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start[sVar20]) goto LAB_0012364a;
      }
      puVar8 = (this->partition_).parents_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar18 = sVar15;
      do {
        sVar20 = sVar18;
        sVar18 = puVar8[sVar20];
        sVar19 = sVar15;
      } while (puVar8[sVar20] != sVar20);
      while (sVar20 != sVar19) {
        sVar18 = puVar8[sVar19];
        puVar8[sVar19] = sVar20;
        sVar19 = sVar18;
      }
      puVar9 = (this->parents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar3 = puVar9[sVar20];
      uVar21 = uVar3;
      do {
        uVar26 = uVar21;
        uVar21 = puVar8[uVar26];
      } while (puVar8[uVar26] != uVar26);
      while (uVar26 != uVar3) {
        uVar21 = puVar8[uVar3];
        puVar8[uVar3] = uVar26;
        uVar3 = uVar21;
      }
      if (puVar9[sVar20] != uVar26) {
        puVar9[sVar20] = uVar26;
      }
      if ((uVar26 == sVar20) || (uVar26 == sVar15)) {
        bVar12 = true;
        if (*(int *)(lVar7 + sVar15 * 0x18) != 0) {
          dVar30 = pDVar6->costBirth;
          sVar18 = sVar15;
          do {
            sVar19 = sVar18;
            sVar18 = puVar8[sVar19];
          } while (puVar8[sVar19] != sVar19);
          while (sVar19 != sVar15) {
            sVar18 = puVar8[sVar15];
            puVar8[sVar15] = sVar19;
            sVar15 = sVar18;
          }
          uVar3 = (this->sizes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[sVar19];
          local_68 = local_68 -
                     dVar30 * (((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) -
                               1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
        }
      }
      else {
        if (uVar26 != sVar17) {
          uStack_60 = 0;
          pmVar5 = (this->vertices_).
                   super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_68 = dVar30;
          if (*(size_t *)((long)&pmVar5[sVar15]._M_t._M_impl.super__Rb_tree_header + 0x20) != 0) {
            pmVar25 = pmVar5 + sVar15;
            p_Var1 = &(pmVar25->_M_t)._M_impl.super__Rb_tree_header;
            p_Var14 = (pmVar25->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var16 = &p_Var1->_M_header;
            for (; p_Var14 != (_Base_ptr)0x0;
                p_Var14 = (&p_Var14->_M_left)[*(ulong *)(p_Var14 + 1) < uVar26]) {
              if (*(ulong *)(p_Var14 + 1) >= uVar26) {
                p_Var16 = p_Var14;
              }
            }
            p_Var14 = &p_Var1->_M_header;
            if (((_Rb_tree_header *)p_Var16 != p_Var1) &&
               (p_Var14 = p_Var16, uVar26 < *(ulong *)(p_Var16 + 1))) {
              p_Var14 = &p_Var1->_M_header;
            }
            if ((_Rb_tree_header *)p_Var14 != p_Var1) {
              local_70 = uVar26;
              pmVar13 = std::
                        map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                        ::at(pmVar25,&local_70);
              dVar30 = *pmVar13;
              puVar8 = (this->partition_).parents_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar23 = uVar26;
              do {
                uVar21 = uVar23;
                uVar23 = puVar8[uVar21];
                uVar3 = uVar26;
              } while (puVar8[uVar21] != uVar21);
              while (uVar21 != uVar3) {
                uVar10 = puVar8[uVar3];
                puVar8[uVar3] = uVar21;
                uVar3 = uVar10;
              }
              local_68 = dVar30 - local_68;
              bVar12 = true;
              uVar3 = uVar26;
              if ((this->children_).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar21] == 1) {
                do {
                  uVar21 = uVar3;
                  uVar3 = puVar8[uVar21];
                } while (puVar8[uVar21] != uVar21);
                while (uVar21 != uVar26) {
                  uVar3 = puVar8[uVar26];
                  puVar8[uVar26] = uVar21;
                  uVar26 = uVar3;
                }
                uVar3 = (this->sizes_).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar21];
                local_68 = local_68 +
                           (((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) -
                            1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) *
                           this->data_->costTermination;
              }
              goto LAB_001237dd;
            }
          }
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Cannot have a parent with no connection!");
          goto LAB_00123946;
        }
        __return_storage_ptr__->v0 = sVar15;
        __return_storage_ptr__->v1 = sVar17;
        __return_storage_ptr__->delta = INFINITY;
        __return_storage_ptr__->edition = 0;
        bVar12 = false;
      }
LAB_001237dd:
      if (!bVar12) {
        return __return_storage_ptr__;
      }
      puVar8 = (this->partition_).parents_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar15 = sVar17;
      do {
        sVar19 = sVar15;
        sVar15 = puVar8[sVar19];
        sVar18 = sVar17;
      } while (puVar8[sVar19] != sVar19);
      while (sVar19 != sVar18) {
        sVar15 = puVar8[sVar18];
        puVar8[sVar18] = sVar19;
        sVar18 = sVar15;
      }
      dVar30 = local_68;
      if (((this->children_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[sVar19] == 0) &&
         (pPVar11 = this->data_->problemGraph,
         pPVar11->numberOfFrames_ - 1 !=
         (long)*(int *)(*(long *)&(pPVar11->problem_->nodes).
                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                                  _M_impl.super__Vector_impl_data + sVar17 * 0x18))) {
        dVar30 = this->data_->costTermination;
        sVar15 = sVar17;
        do {
          sVar18 = sVar15;
          sVar15 = puVar8[sVar18];
        } while (puVar8[sVar18] != sVar18);
        while (sVar18 != sVar17) {
          sVar15 = puVar8[sVar17];
          puVar8[sVar17] = sVar18;
          sVar17 = sVar15;
        }
        uVar3 = (this->sizes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start[sVar18];
        dVar30 = local_68 -
                 dVar30 * (((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) -
                           1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
      }
LAB_001238f8:
      local_48->v0 = v0;
      local_48->v1 = v1;
      local_48->delta = dVar30;
      local_48->edition = 0;
      return local_48;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Cannot propose move for an edge that does not exist!");
LAB_00123946:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline EdgeOperation proposeMove(const size_t v0, const size_t v1)
    {
        // increaseEdition(v0, v1); // invalidate old moves along (v0, v1)

        if (!edgeExists(v0, v1)) {
            throw std::runtime_error(
                "Cannot propose move for an edge that does not exist!");
        }

        // first part of cost change through merge / setParent.
        auto delta = -getEdgeWeight(v0, v1);

        // potential merge.
        if (getFrameOfNode(v0) == getFrameOfNode(v1)) {

            const auto& p0 = hasParent(v0);
            const auto& p1 = hasParent(v1);

            // Cases that can be merged:
            if (p0.first xor p1.first) { // one with parents.
                if (getFrameOfNode(v0) != 0) {
                    const size_t partitionSize =
                        p0.first ? sizeOf(v1) : sizeOf(v0);
                    delta -= data_.costBirth * partitionSize;
                }
            } else if (!p0.first && !p1.first) { // no parents.
                ;
            } else if (p0.first && p1.first &&
                       p0.second == p1.second) { // same parents.
                ;
            } else { // the rest cant.
                return {
                    v0, v1,
                    std::numeric_limits<typename EVA::value_type>::infinity(), 0
                };
            }

            // cost adjustments for all nodes that have either first
            // or second as a parent and share connections to the other.
            for (const auto& other : getAdjacentVertices(v1)) {
                const auto& v2 = other.first;
                const auto& p2 = hasParent(v2);

                if (edgeExists(v0, v2)) {
                    // is v2 a parent to v0 and not v1?
                    // (or vice versa)
                    if (p0.second == findRep(v2) and p1.second != findRep(v2)) {
                        delta -= getEdgeWeight(v1, v2);
                    } else if (p1.second == findRep(v2) and
                               p0.second != findRep(v2)) {
                        delta -= getEdgeWeight(v0, v2);
                    } else {

                        // is either v0 or v1 a parent of v2?
                        if (p2.first) {
                            if (p2.second ==
                                findRep(v0)) { // v0 is parent to v2
                                delta -= getEdgeWeight(v1, v2);
                            } else if (p2.second ==
                                       findRep(v1)) { // v1 is parent to v2
                                delta -= getEdgeWeight(v0, v2);
                            }
                        }
                    }
                }
            }

            // if one has no child, we gain a termination cost.
            if (!hasChild(v0) xor !hasChild(v1)) {
                if (getFrameOfNode(v0) !=
                    data_.problemGraph.numberOfFrames() - 1) {

                    const size_t partitionSize =
                        hasChild(v0) ? sizeOf(v1) : sizeOf(v0);
                    delta -= data_.costTermination * partitionSize;
                }
            } else if (this->data_.enforceBifurcationConstraint &&
                       children(v0) + children(v1) >= 3) {
                delta =
                    std::numeric_limits<typename EVA::value_type>::infinity();
            }

            return { v0, v1, delta, 0 };

            // Potential new parent.
        } else {
            size_t child = v0;
            size_t parent = v1;

            if (getFrameOfNode(child) < getFrameOfNode(parent)) {
                std::swap(child, parent);
            }

            // If bifurcation constraint is active:
            //    dont allow more than two children!
            if (this->data_.enforceBifurcationConstraint) {
                if (children(parent) >= 2) {
                    return { v0, v1, std::numeric_limits<
                                         typename EVA::value_type>::infinity(),
                             0 };
                }
            }

            // is it a re-set?
            {
                auto parentOfChild = hasParent(child);
                if (parentOfChild.first) {

                    if (parentOfChild.second == parent) {
                        return { child, parent,
                                 std::numeric_limits<
                                     typename EVA::value_type>::infinity(),
                                 0 };
                    } else {
                        if (!edgeExists(child, parentOfChild.second)) {
                            throw std::runtime_error(
                                "Cannot have a parent with no connection!");
                        }

                        delta += getEdgeWeight(child, parentOfChild.second);

                        // would the current parent form a terminal?
                        if (children(parentOfChild.second) == 1) {
                            delta += sizeOf(parentOfChild.second) *
                                     data_.costTermination;
                        }
                    }
                    // could we save birth costs?
                } else if (getFrameOfNode(child) != 0) {
                    delta -= data_.costBirth * sizeOf(child);
                }
            }

            if (!hasChild(parent) and
                getFrameOfNode(parent) !=
                    data_.problemGraph.numberOfFrames() - 1) {
                delta -= data_.costTermination * sizeOf(parent);
            }

            return { v0, v1, delta, 0 };
        }
    }